

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::emit_custom_templates(CompilerMSL *this)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)::std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_color == 0x14) {
      CompilerGLSL::statement<char_const(&)[33]>
                (&this->super_CompilerGLSL,(char (*) [33])"template<typename T, size_t Num>");
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"struct spvUnsafeArray");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[27]>
                (&this->super_CompilerGLSL,(char (*) [27])"T elements[Num ? Num : 1];");
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
      CompilerGLSL::statement<char_const(&)[42]>
                (&this->super_CompilerGLSL,
                 (char (*) [42])"thread T& operator [] (size_t pos) thread");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[64]>
                (&this->super_CompilerGLSL,
                 (char (*) [64])"constexpr const thread T& operator [] (size_t pos) const thread");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
      CompilerGLSL::statement<char_const(&)[42]>
                (&this->super_CompilerGLSL,
                 (char (*) [42])"device T& operator [] (size_t pos) device");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[64]>
                (&this->super_CompilerGLSL,
                 (char (*) [64])"constexpr const device T& operator [] (size_t pos) const device");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
      CompilerGLSL::statement<char_const(&)[68]>
                (&this->super_CompilerGLSL,
                 (char (*) [68])
                 "constexpr const constant T& operator [] (size_t pos) const constant");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
      CompilerGLSL::statement<char_const(&)[52]>
                (&this->super_CompilerGLSL,
                 (char (*) [52])"threadgroup T& operator [] (size_t pos) threadgroup");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[74]>
                (&this->super_CompilerGLSL,
                 (char (*) [74])
                 "constexpr const threadgroup T& operator [] (size_t pos) const threadgroup");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
    }
  }
  return;
}

Assistant:

void CompilerMSL::emit_custom_templates()
{
	for (const auto &spv_func : spv_function_implementations)
	{
		switch (spv_func)
		{
		case SPVFuncImplUnsafeArray:
			statement("template<typename T, size_t Num>");
			statement("struct spvUnsafeArray");
			begin_scope();
			statement("T elements[Num ? Num : 1];");
			statement("");
			statement("thread T& operator [] (size_t pos) thread");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("constexpr const thread T& operator [] (size_t pos) const thread");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("");
			statement("device T& operator [] (size_t pos) device");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("constexpr const device T& operator [] (size_t pos) const device");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("");
			statement("constexpr const constant T& operator [] (size_t pos) const constant");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("");
			statement("threadgroup T& operator [] (size_t pos) threadgroup");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("constexpr const threadgroup T& operator [] (size_t pos) const threadgroup");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			end_scope_decl();
			statement("");
			break;

		default:
			break;
		}
	}
}